

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

int __thiscall icu_63::ReorderingBuffer::init(ReorderingBuffer *this,EVP_PKEY_CTX *ctx)

{
  short sVar1;
  int32_t iVar2;
  UnicodeString *this_00;
  byte bVar3;
  char16_t *pcVar4;
  int iVar5;
  undefined4 *in_RDX;
  int iVar6;
  
  this_00 = this->str;
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  iVar2 = (this_00->fUnion).fFields.fLength;
  pcVar4 = UnicodeString::getBuffer(this_00,(int32_t)ctx);
  this->start = pcVar4;
  if (pcVar4 == (char16_t *)0x0) {
    *in_RDX = 7;
    iVar5 = 0;
  }
  else {
    iVar5 = (int)sVar1 >> 5;
    if (sVar1 < 0) {
      iVar5 = iVar2;
    }
    this->limit = pcVar4 + iVar5;
    iVar6 = 0x1b;
    if (((this->str->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
      iVar6 = (this->str->fUnion).fFields.fCapacity;
    }
    this->remainingCapacity = iVar6 - iVar5;
    this->reorderStart = pcVar4;
    if (iVar5 == 0) {
      this->lastCC = '\0';
    }
    else {
      this->codePointStart = pcVar4 + iVar5;
      bVar3 = previousCC(this);
      this->lastCC = bVar3;
      while (1 < bVar3) {
        bVar3 = previousCC(this);
      }
      pcVar4 = this->codePointLimit;
      this->reorderStart = pcVar4;
    }
    iVar5 = (int)CONCAT71((int7)((ulong)pcVar4 >> 8),1);
  }
  return iVar5;
}

Assistant:

UBool ReorderingBuffer::init(int32_t destCapacity, UErrorCode &errorCode) {
    int32_t length=str.length();
    start=str.getBuffer(destCapacity);
    if(start==NULL) {
        // getBuffer() already did str.setToBogus()
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return FALSE;
    }
    limit=start+length;
    remainingCapacity=str.getCapacity()-length;
    reorderStart=start;
    if(start==limit) {
        lastCC=0;
    } else {
        setIterator();
        lastCC=previousCC();
        // Set reorderStart after the last code point with cc<=1 if there is one.
        if(lastCC>1) {
            while(previousCC()>1) {}
        }
        reorderStart=codePointLimit;
    }
    return TRUE;
}